

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::RenderNavHighlight(ImRect *bb,ImGuiID id,ImGuiNavHighlightFlags flags)

{
  ImRect IVar1;
  ImGuiWindow *pIVar2;
  ImDrawList *pIVar3;
  undefined1 auVar4 [16];
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  ImU32 IVar9;
  undefined4 unaff_R15D;
  int iVar10;
  uint uVar11;
  uint uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float local_6c;
  ImVec2 local_68;
  ImVec2 aIStack_60 [2];
  ImVec2 local_50;
  ImVec4 local_48;
  ImVec2 local_38;
  
  if ((GImGui->NavId == id) &&
     ((((flags & 4U) != 0 || (GImGui->NavDisableHighlight == false)) &&
      (pIVar2 = GImGui->CurrentWindow, (pIVar2->DC).NavHideHighlightOneFrame == false)))) {
    local_6c = 0.0;
    if ((flags & 8U) == 0) {
      local_6c = (GImGui->Style).FrameRounding;
    }
    IVar1 = pIVar2->ClipRect;
    fVar13 = IVar1.Min.x;
    fVar14 = IVar1.Min.y;
    fVar15 = (bb->Min).x;
    fVar16 = (bb->Min).y;
    auVar17._8_8_ = 0;
    auVar17._0_4_ = (bb->Max).x;
    auVar17._4_4_ = (bb->Max).y;
    uVar11 = -(uint)(fVar13 <= fVar15);
    uVar12 = -(uint)(fVar14 <= fVar16);
    local_68 = (ImVec2)(CONCAT44(~uVar12 & (uint)fVar14,~uVar11 & (uint)fVar13) |
                       CONCAT44((uint)fVar16 & uVar12,(uint)fVar15 & uVar11));
    auVar18._8_4_ = IVar1.Max.x;
    auVar18._0_4_ = IVar1.Max.x;
    auVar18._4_4_ = IVar1.Max.y;
    auVar18._12_4_ = IVar1.Max.y;
    auVar18 = minps(auVar17,auVar18);
    aIStack_60[0] = auVar18._0_8_;
    if ((flags & 1U) != 0) {
      aIStack_60[0].x = auVar18._0_4_;
      aIStack_60[0].y = auVar18._4_4_;
      local_68.x = local_68.x + -4.0;
      local_68.y = local_68.y + -4.0;
      aIStack_60[0].x = aIStack_60[0].x + 4.0;
      aIStack_60[0].y = aIStack_60[0].y + 4.0;
      auVar4._4_4_ = -(uint)(fVar14 <= local_68.y);
      auVar4._0_4_ = -(uint)(fVar13 <= local_68.x);
      auVar4._8_4_ = -(uint)(aIStack_60[0].x <= IVar1.Max.x);
      auVar4._12_4_ = -(uint)(aIStack_60[0].y <= IVar1.Max.y);
      iVar10 = movmskps(unaff_R15D,auVar4);
      if (iVar10 != 0xf) {
        ImDrawList::PushClipRect(pIVar2->DrawList,local_68,aIStack_60[0],false);
      }
      pIVar3 = pIVar2->DrawList;
      local_50.y = local_68.y + 1.0;
      local_50.x = local_68.x + 1.0;
      local_38.y = aIStack_60[0].y + -1.0;
      local_38.x = aIStack_60[0].x + -1.0;
      local_48.x = (GImGui->Style).Colors[0x31].x;
      local_48.y = (GImGui->Style).Colors[0x31].y;
      uVar5 = (GImGui->Style).Colors[0x31].z;
      uVar6 = (GImGui->Style).Colors[0x31].w;
      local_48.w = (GImGui->Style).Alpha * (float)uVar6;
      local_48.z = (float)uVar5;
      IVar9 = ColorConvertFloat4ToU32(&local_48);
      ImDrawList::AddRect(pIVar3,&local_50,&local_38,IVar9,local_6c,0xf,2.0);
      if ((char)iVar10 != '\x0f') {
        ImDrawList::PopClipRect(pIVar2->DrawList);
      }
    }
    if ((flags & 2U) != 0) {
      pIVar3 = pIVar2->DrawList;
      local_48.x = (GImGui->Style).Colors[0x31].x;
      local_48.y = (GImGui->Style).Colors[0x31].y;
      uVar7 = (GImGui->Style).Colors[0x31].z;
      uVar8 = (GImGui->Style).Colors[0x31].w;
      local_48.w = (GImGui->Style).Alpha * (float)uVar8;
      local_48.z = (float)uVar7;
      IVar9 = ColorConvertFloat4ToU32(&local_48);
      ImDrawList::AddRect(pIVar3,&local_68,aIStack_60,IVar9,local_6c,-1,1.0);
    }
  }
  return;
}

Assistant:

void ImGui::RenderNavHighlight(const ImRect& bb, ImGuiID id, ImGuiNavHighlightFlags flags)
{
    ImGuiContext& g = *GImGui;
    if (id != g.NavId)
        return;
    if (g.NavDisableHighlight && !(flags & ImGuiNavHighlightFlags_AlwaysDraw))
        return;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->DC.NavHideHighlightOneFrame)
        return;

    float rounding = (flags & ImGuiNavHighlightFlags_NoRounding) ? 0.0f : g.Style.FrameRounding;
    ImRect display_rect = bb;
    display_rect.ClipWith(window->ClipRect);
    if (flags & ImGuiNavHighlightFlags_TypeDefault)
    {
        const float THICKNESS = 2.0f;
        const float DISTANCE = 3.0f + THICKNESS * 0.5f;
        display_rect.Expand(ImVec2(DISTANCE, DISTANCE));
        bool fully_visible = window->ClipRect.Contains(display_rect);
        if (!fully_visible)
            window->DrawList->PushClipRect(display_rect.Min, display_rect.Max);
        window->DrawList->AddRect(display_rect.Min + ImVec2(THICKNESS * 0.5f, THICKNESS * 0.5f), display_rect.Max - ImVec2(THICKNESS * 0.5f, THICKNESS * 0.5f), GetColorU32(ImGuiCol_NavHighlight), rounding, ImDrawCornerFlags_All, THICKNESS);
        if (!fully_visible)
            window->DrawList->PopClipRect();
    }
    if (flags & ImGuiNavHighlightFlags_TypeThin)
    {
        window->DrawList->AddRect(display_rect.Min, display_rect.Max, GetColorU32(ImGuiCol_NavHighlight), rounding, ~0, 1.0f);
    }
}